

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void openStatTable(Parse *pParse,int iDb,int iStatCur,char *zWhere,char *zWhereType)

{
  sqlite3 *db_00;
  char *zName;
  Vdbe *p;
  Db *pDVar1;
  Table *pTVar2;
  Table *pStat;
  char *zTab;
  Vdbe *v;
  Db *pDb;
  sqlite3 *db;
  int i;
  u8 aCreateTbl [2];
  int aRoot [2];
  char *zWhereType_local;
  char *zWhere_local;
  int iStatCur_local;
  int iDb_local;
  Parse *pParse_local;
  
  memset(&i,0,8);
  memset((void *)((long)&db + 6),0,2);
  db_00 = pParse->db;
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    pDVar1 = db_00->aDb + iDb;
    for (db._0_4_ = 0; (int)db < 1; db._0_4_ = (int)db + 1) {
      zName = openStatTable::aTable[(int)db].zName;
      pTVar2 = sqlite3FindTable(db_00,zName,pDVar1->zName);
      if (pTVar2 == (Table *)0x0) {
        sqlite3NestedParse(pParse,"CREATE TABLE %Q.%s(%s)",pDVar1->zName,zName,
                           openStatTable::aTable[(int)db].zCols);
        (&i)[(int)db] = pParse->regRoot;
        *(undefined1 *)((long)&db + (long)(int)db + 6) = 2;
      }
      else {
        (&i)[(int)db] = pTVar2->tnum;
        sqlite3TableLock(pParse,iDb,(&i)[(int)db],'\x01',zName);
        if (zWhere == (char *)0x0) {
          sqlite3VdbeAddOp2(p,0x67,(&i)[(int)db],iDb);
        }
        else {
          sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",pDVar1->zName,zName,zWhereType,
                             zWhere);
        }
      }
    }
    for (db._0_4_ = 0; (int)db < 1; db._0_4_ = (int)db + 1) {
      sqlite3VdbeAddOp3(p,0x28,iStatCur + (int)db,(&i)[(int)db],iDb);
      sqlite3VdbeChangeP4(p,-1,&DAT_00000003,-0xe);
      sqlite3VdbeChangeP5(p,*(u8 *)((long)&db + (long)(int)db + 6));
    }
  }
  return;
}

Assistant:

static void openStatTable(
  Parse *pParse,          /* Parsing context */
  int iDb,                /* The database we are looking in */
  int iStatCur,           /* Open the sqlite_stat1 table on this cursor */
  const char *zWhere,     /* Delete entries for this table or index */
  const char *zWhereType  /* Either "tbl" or "idx" */
){
  static const struct {
    const char *zName;
    const char *zCols;
  } aTable[] = {
    { "sqlite_stat1", "tbl,idx,stat" },
#ifdef SQLITE_ENABLE_STAT3
    { "sqlite_stat3", "tbl,idx,neq,nlt,ndlt,sample" },
#endif
  };

  int aRoot[] = {0, 0};
  u8 aCreateTbl[] = {0, 0};

  int i;
  sqlite3 *db = pParse->db;
  Db *pDb;
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3VdbeDb(v)==db );
  pDb = &db->aDb[iDb];

  /* Create new statistic tables if they do not exist, or clear them
  ** if they do already exist.
  */
  for(i=0; i<ArraySize(aTable); i++){
    const char *zTab = aTable[i].zName;
    Table *pStat;
    if( (pStat = sqlite3FindTable(db, zTab, pDb->zName))==0 ){
      /* The sqlite_stat[12] table does not exist. Create it. Note that a 
      ** side-effect of the CREATE TABLE statement is to leave the rootpage 
      ** of the new table in register pParse->regRoot. This is important 
      ** because the OpenWrite opcode below will be needing it. */
      sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.%s(%s)", pDb->zName, zTab, aTable[i].zCols
      );
      aRoot[i] = pParse->regRoot;
      aCreateTbl[i] = OPFLAG_P2ISREG;
    }else{
      /* The table already exists. If zWhere is not NULL, delete all entries 
      ** associated with the table zWhere. If zWhere is NULL, delete the
      ** entire contents of the table. */
      aRoot[i] = pStat->tnum;
      sqlite3TableLock(pParse, iDb, aRoot[i], 1, zTab);
      if( zWhere ){
        sqlite3NestedParse(pParse,
           "DELETE FROM %Q.%s WHERE %s=%Q", pDb->zName, zTab, zWhereType, zWhere
        );
      }else{
        /* The sqlite_stat[12] table already exists.  Delete all rows. */
        sqlite3VdbeAddOp2(v, OP_Clear, aRoot[i], iDb);
      }
    }
  }

  /* Open the sqlite_stat[13] tables for writing. */
  for(i=0; i<ArraySize(aTable); i++){
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iStatCur+i, aRoot[i], iDb);
    sqlite3VdbeChangeP4(v, -1, (char *)3, P4_INT32);
    sqlite3VdbeChangeP5(v, aCreateTbl[i]);
  }
}